

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLogLog>
               (GetterXRefYs<float> *getter1,GetterXRefYs<float> *getter2,
               TransformerLogLog *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  ImPlotPlot *pIVar7;
  double dVar8;
  double dVar9;
  ImPlotContext *pIVar10;
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterXRefYs<float> *local_50;
  TransformerLogLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar10 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLogLog>>
              ((LineSegmentsRenderer<ImPlot::GetterXRefYs<float>,_ImPlot::GetterXRefYs<float>,_ImPlot::TransformerLogLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar13 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar13 = getter1->Count;
    }
    if (0 < iVar13) {
      iVar14 = 0;
      do {
        pIVar11 = GImPlot;
        iVar6 = getter1->Count;
        fVar19 = *(float *)((long)getter1->Ys +
                           (long)(((getter1->Offset + iVar14) % iVar6 + iVar6) % iVar6) *
                           (long)getter1->Stride);
        dVar8 = log10(getter1->XRef / (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar7 = pIVar11->CurrentPlot;
        dVar2 = pIVar11->LogDenX;
        dVar3 = (pIVar7->XAxis).Range.Min;
        dVar4 = (pIVar7->XAxis).Range.Max;
        dVar9 = log10((double)fVar19 / pIVar7->YAxis[transformer->YAxis].Range.Min);
        pIVar12 = GImPlot;
        iVar6 = transformer->YAxis;
        pIVar7 = pIVar11->CurrentPlot;
        auVar20._8_8_ = pIVar11->LogDenY[iVar6];
        auVar20._0_8_ = dVar2;
        auVar17._8_8_ = dVar9;
        auVar17._0_8_ = dVar8;
        auVar17 = divpd(auVar17,auVar20);
        dVar2 = pIVar7->YAxis[iVar6].Range.Min;
        IVar5 = pIVar11->PixelRange[iVar6].Min;
        local_58._4_4_ =
             (float)(pIVar11->My[iVar6] *
                     (((double)(float)auVar17._8_8_ * (pIVar7->YAxis[iVar6].Range.Max - dVar2) +
                      dVar2) - dVar2) + (double)IVar5.y);
        local_58._0_4_ =
             (float)(pIVar11->Mx *
                     (((double)(float)auVar17._0_8_ * (dVar4 - dVar3) + dVar3) -
                     (pIVar7->XAxis).Range.Min) + (double)IVar5.x);
        iVar6 = getter2->Count;
        fVar19 = *(float *)((long)getter2->Ys +
                           (long)(((getter2->Offset + iVar14) % iVar6 + iVar6) % iVar6) *
                           (long)getter2->Stride);
        dVar8 = log10(getter2->XRef / (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar7 = pIVar12->CurrentPlot;
        dVar2 = pIVar12->LogDenX;
        dVar3 = (pIVar7->XAxis).Range.Min;
        dVar4 = (pIVar7->XAxis).Range.Max;
        dVar9 = log10((double)fVar19 / pIVar7->YAxis[transformer->YAxis].Range.Min);
        iVar6 = transformer->YAxis;
        pIVar7 = pIVar12->CurrentPlot;
        auVar18._8_8_ = dVar9;
        auVar18._0_8_ = dVar8;
        auVar21._8_8_ = pIVar12->LogDenY[iVar6];
        auVar21._0_8_ = dVar2;
        auVar17 = divpd(auVar18,auVar21);
        dVar2 = pIVar7->YAxis[iVar6].Range.Min;
        IVar5 = pIVar12->PixelRange[iVar6].Min;
        fVar15 = (float)(pIVar12->Mx *
                         (((double)(float)auVar17._0_8_ * (dVar4 - dVar3) + dVar3) -
                         (pIVar7->XAxis).Range.Min) + (double)IVar5.x);
        fVar16 = (float)(pIVar12->My[iVar6] *
                         (((double)(float)auVar17._8_8_ * (pIVar7->YAxis[iVar6].Range.Max - dVar2) +
                          dVar2) - dVar2) + (double)IVar5.y);
        local_60.y = fVar16;
        local_60.x = fVar15;
        pIVar7 = pIVar10->CurrentPlot;
        fVar19 = (float)local_58._4_4_;
        if (fVar16 <= (float)local_58._4_4_) {
          fVar19 = fVar16;
        }
        if ((fVar19 < (pIVar7->PlotRect).Max.y) &&
           (fVar19 = (float)(~-(uint)(fVar16 <= (float)local_58._4_4_) & (uint)fVar16 |
                            local_58._4_4_ & -(uint)(fVar16 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar7->PlotRect).Min.y, *pfVar1 <= fVar19 && fVar19 != *pfVar1)) {
          fVar19 = (float)local_58._0_4_;
          if (fVar15 <= (float)local_58._0_4_) {
            fVar19 = fVar15;
          }
          if ((fVar19 < (pIVar7->PlotRect).Max.x) &&
             (fVar19 = (float)(-(uint)(fVar15 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar15 <= (float)local_58._0_4_) & (uint)fVar15),
             (pIVar7->PlotRect).Min.x <= fVar19 && fVar19 != (pIVar7->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar14 = iVar14 + 1;
      } while (iVar13 != iVar14);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}